

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

QModelIndexList * __thiscall
QAbstractItemViewPrivate::selectedDraggableIndexes
          (QModelIndexList *__return_storage_ptr__,QAbstractItemViewPrivate *this)

{
  QModelIndex *pQVar1;
  long *plVar2;
  quintptr qVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  iterator aend;
  iterator iVar7;
  long lVar8;
  QModelIndex *pQVar9;
  const_iterator abegin;
  QModelIndex *pQVar10;
  QModelIndex *pQVar11;
  
  plVar2 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  (**(code **)(*plVar2 + 0x2d8))();
  pQVar11 = (__return_storage_ptr__->d).ptr;
  lVar6 = (__return_storage_ptr__->d).size;
  lVar8 = lVar6 >> 2;
  pQVar9 = pQVar11;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    do {
      uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar9);
      pQVar10 = pQVar9;
      if ((uVar5 & 4) == 0) goto LAB_0053dbc9;
      uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar9 + 1);
      pQVar10 = pQVar9 + 1;
      if ((uVar5 & 4) == 0) goto LAB_0053dbc9;
      uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar9 + 2);
      pQVar10 = pQVar9 + 2;
      if ((uVar5 & 4) == 0) goto LAB_0053dbc9;
      uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar9 + 3);
      pQVar10 = pQVar9 + 3;
      if ((uVar5 & 4) == 0) goto LAB_0053dbc9;
      pQVar9 = pQVar9 + 4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  pQVar1 = pQVar11 + lVar6;
  lVar6 = ((long)pQVar1 - (long)pQVar9 >> 3) * -0x5555555555555555;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pQVar10 = pQVar1;
      if ((lVar6 != 3) ||
         (uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar9), pQVar10 = pQVar9,
         (uVar5 & 4) == 0)) goto LAB_0053dbc9;
      pQVar9 = pQVar9 + 1;
    }
    uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar9);
    pQVar10 = pQVar9;
    if ((uVar5 & 4) == 0) goto LAB_0053dbc9;
    pQVar9 = pQVar9 + 1;
  }
  uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar9);
  pQVar10 = pQVar1;
  if ((uVar5 & 4) == 0) {
    pQVar10 = pQVar9;
  }
LAB_0053dbc9:
  lVar6 = (long)pQVar10 - (long)pQVar11;
  if ((lVar6 >> 3) * -0x5555555555555555 - (__return_storage_ptr__->d).size != 0) {
    aend = QList<QModelIndex>::end(__return_storage_ptr__);
    iVar7 = QList<QModelIndex>::begin(__return_storage_ptr__);
    abegin.i = iVar7.i + lVar6;
    pQVar11 = lVar6 + iVar7.i;
    while (pQVar9 = pQVar11, pQVar11 = pQVar9 + 1, pQVar11 != aend.i) {
      uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11);
      if ((uVar5 & 4) != 0) {
        ((abegin.i)->m).ptr = pQVar9[1].m.ptr;
        iVar4 = pQVar11->c;
        qVar3 = pQVar9[1].i;
        (abegin.i)->r = pQVar11->r;
        (abegin.i)->c = iVar4;
        (abegin.i)->i = qVar3;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QModelIndex>::erase(__return_storage_ptr__,abegin,(const_iterator)aend.i);
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QAbstractItemViewPrivate::selectedDraggableIndexes() const
{
    Q_Q(const QAbstractItemView);
    QModelIndexList indexes = q->selectedIndexes();
    auto isNotDragEnabled = [this](const QModelIndex &index) {
        return !isIndexDragEnabled(index);
    };
    indexes.removeIf(isNotDragEnabled);
    return indexes;
}